

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prevector.h
# Opt level: O3

void __thiscall
prevector<8U,_int,_unsigned_int,_int>::insert
          (prevector<8U,_int,_unsigned_int,_int> *this,iterator pos,size_type count,int *value)

{
  void *__src;
  long lVar1;
  prevector<8U,_int,_unsigned_int,_int> *ppVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  uint uVar6;
  prevector<8U,_int,_unsigned_int,_int> *ppVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  long lVar11;
  uint uVar12;
  long lVar13;
  ulong uVar14;
  int iVar15;
  long in_FS_OFFSET;
  int iVar17;
  undefined1 auVar16 [16];
  undefined1 auVar18 [16];
  int iVar20;
  undefined1 auVar19 [16];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar6 = this->_size;
  uVar8 = uVar6 - 9;
  ppVar7 = (prevector<8U,_int,_unsigned_int,_int> *)(this->_union).indirect_contents.indirect;
  uVar12 = uVar8;
  ppVar2 = ppVar7;
  if (uVar6 < 9) {
    uVar12 = uVar6;
    ppVar2 = this;
  }
  uVar10 = 8;
  if (uVar6 >= 9) {
    uVar10 = (this->_union).indirect_contents.capacity;
  }
  uVar12 = uVar12 + count;
  if (uVar10 < uVar12) {
    change_capacity(this,(uVar12 >> 1) + uVar12);
    uVar6 = this->_size;
    ppVar7 = (prevector<8U,_int,_unsigned_int,_int> *)(this->_union).indirect_contents.indirect;
    uVar8 = uVar6 - 9;
  }
  if (uVar6 < 9) {
    ppVar7 = this;
  }
  iVar15 = (int)((ulong)((long)pos.ptr - (long)ppVar2) >> 2);
  lVar13 = (long)iVar15;
  __src = (void *)((long)&ppVar7->_union + lVar13 * 4);
  if (uVar6 < 9) {
    uVar8 = uVar6;
  }
  memmove((void *)((long)__src + (ulong)count * 4),__src,(ulong)(uVar8 - iVar15) << 2);
  uVar8 = this->_size + count;
  this->_size = uVar8;
  auVar5 = _DAT_00e4a2c0;
  auVar4 = _DAT_00e4a2b0;
  auVar3 = _DAT_00e4a2a0;
  if (count != 0) {
    if (8 < uVar8) {
      this = (prevector<8U,_int,_unsigned_int,_int> *)(this->_union).indirect_contents.indirect;
    }
    iVar15 = *value;
    uVar14 = (ulong)count + 0x3fffffffffffffff;
    uVar9 = uVar14 & 0x3fffffffffffffff;
    auVar16._8_4_ = (int)uVar9;
    auVar16._0_8_ = uVar9;
    auVar16._12_4_ = (int)(uVar9 >> 0x20);
    lVar11 = 0;
    auVar16 = auVar16 ^ _DAT_00e4a2c0;
    do {
      auVar18._8_4_ = (int)lVar11;
      auVar18._0_8_ = lVar11;
      auVar18._12_4_ = (int)((ulong)lVar11 >> 0x20);
      auVar19 = (auVar18 | auVar4) ^ auVar5;
      iVar17 = auVar16._4_4_;
      if ((bool)(~(auVar19._4_4_ == iVar17 && auVar16._0_4_ < auVar19._0_4_ ||
                  iVar17 < auVar19._4_4_) & 1)) {
        *(int *)((long)&this->_union + lVar11 * 4 + lVar13 * 4) = iVar15;
      }
      if ((auVar19._12_4_ != auVar16._12_4_ || auVar19._8_4_ <= auVar16._8_4_) &&
          auVar19._12_4_ <= auVar16._12_4_) {
        *(int *)((long)&this->_union + lVar11 * 4 + lVar13 * 4 + 4) = iVar15;
      }
      auVar18 = (auVar18 | auVar3) ^ auVar5;
      iVar20 = auVar18._4_4_;
      if (iVar20 <= iVar17 && (iVar20 != iVar17 || auVar18._0_4_ <= auVar16._0_4_)) {
        *(int *)((long)&this->_union + lVar11 * 4 + lVar13 * 4 + 8) = iVar15;
        *(int *)((long)&this->_union + lVar11 * 4 + lVar13 * 4 + 0xc) = iVar15;
      }
      lVar11 = lVar11 + 4;
    } while ((uVar9 - ((uint)uVar14 & 3)) + 4 != lVar11);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void insert(iterator pos, size_type count, const T& value) {
        size_type p = pos - begin();
        size_type new_size = size() + count;
        if (capacity() < new_size) {
            change_capacity(new_size + (new_size >> 1));
        }
        T* ptr = item_ptr(p);
        T* dst = ptr + count;
        memmove(dst, ptr, (size() - p) * sizeof(T));
        _size += count;
        fill(item_ptr(p), count, value);
    }